

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus DecodeINSVE_DF_4(MCInst *MI,uint32_t insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint32_t uVar1;
  int iVar2;
  bool bVar3;
  code *local_40;
  DecodeFN RegDecoder;
  uint NSize;
  uint32_t tmp;
  MCRegisterInfo *Decoder_local;
  uint64_t Address_local;
  uint32_t insn_local;
  MCInst *MI_local;
  
  uVar1 = fieldFromInstruction(insn,0x11,5);
  local_40 = (code *)0x0;
  if ((uVar1 & 0x18) == 0) {
    RegDecoder._0_4_ = 4;
    local_40 = DecodeMSA128BRegisterClass;
  }
  else if ((uVar1 & 0x1c) == 0x10) {
    RegDecoder._0_4_ = 3;
    local_40 = DecodeMSA128HRegisterClass;
  }
  else if ((uVar1 & 0x1e) == 0x18) {
    RegDecoder._0_4_ = 2;
    local_40 = DecodeMSA128WRegisterClass;
  }
  else {
    bVar3 = (uVar1 & 0x1f) == 0x1c;
    if (bVar3) {
      local_40 = DecodeMSA128DRegisterClass;
    }
    RegDecoder._0_4_ = (uint)bVar3;
  }
  if (local_40 == (code *)0x0) {
    MI_local._4_4_ = MCDisassembler_Fail;
  }
  else {
    uVar1 = fieldFromInstruction(insn,6,5);
    iVar2 = (*local_40)(MI,uVar1,Address,Decoder);
    if (iVar2 == 0) {
      MI_local._4_4_ = MCDisassembler_Fail;
    }
    else {
      iVar2 = (*local_40)(MI,uVar1,Address,Decoder);
      if (iVar2 == 0) {
        MI_local._4_4_ = MCDisassembler_Fail;
      }
      else {
        uVar1 = fieldFromInstruction(insn,0x10,(uint)RegDecoder);
        MCOperand_CreateImm0(MI,(ulong)uVar1);
        uVar1 = fieldFromInstruction(insn,0xb,5);
        iVar2 = (*local_40)(MI,uVar1,Address,Decoder);
        if (iVar2 == 0) {
          MI_local._4_4_ = MCDisassembler_Fail;
        }
        else {
          MCOperand_CreateImm0(MI,0);
          MI_local._4_4_ = MCDisassembler_Success;
        }
      }
    }
  }
  return MI_local._4_4_;
}

Assistant:

static DecodeStatus DecodeINSVE_DF_4(MCInst *MI, uint32_t insn,
		uint64_t Address, MCRegisterInfo *Decoder)
{
	typedef DecodeStatus (*DecodeFN)(MCInst *, unsigned, uint64_t, MCRegisterInfo *);
	// The size of the n field depends on the element size
	// The register class also depends on this.
	uint32_t tmp = fieldFromInstruction(insn, 17, 5);
	unsigned NSize = 0;
	DecodeFN RegDecoder = NULL;

	if ((tmp & 0x18) == 0x00) { // INSVE_B
		NSize = 4;
		RegDecoder = DecodeMSA128BRegisterClass;
	} else if ((tmp & 0x1c) == 0x10) { // INSVE_H
		NSize = 3;
		RegDecoder = DecodeMSA128HRegisterClass;
	} else if ((tmp & 0x1e) == 0x18) { // INSVE_W
		NSize = 2;
		RegDecoder = DecodeMSA128WRegisterClass;
	} else if ((tmp & 0x1f) == 0x1c) { // INSVE_D
		NSize = 1;
		RegDecoder = DecodeMSA128DRegisterClass;
	} //else llvm_unreachable("Invalid encoding");

	//assert(NSize != 0 && RegDecoder != nullptr);

	if (RegDecoder == NULL)
		return MCDisassembler_Fail;

	// $wd
	tmp = fieldFromInstruction(insn, 6, 5);
	if (RegDecoder(MI, tmp, Address, Decoder) == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	// $wd_in
	if (RegDecoder(MI, tmp, Address, Decoder) == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	// $n
	tmp = fieldFromInstruction(insn, 16, NSize);
	MCOperand_CreateImm0(MI, tmp);

	// $ws
	tmp = fieldFromInstruction(insn, 11, 5);
	if (RegDecoder(MI, tmp, Address, Decoder) == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	// $n2
	MCOperand_CreateImm0(MI, 0);

	return MCDisassembler_Success;
}